

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStreamComponent_DetermineFramesPerBuffer
                  (PaAlsaStreamComponent *self,PaStreamParameters *params,
                  unsigned_long framesPerUserBuffer,double sampleRate,snd_pcm_hw_params_t *hwParams,
                  int *accurate)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  pthread_t pVar4;
  char *errorText;
  uint uVar5;
  char *format;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  unsigned_long framesPerHostBuffer;
  int local_4c;
  uint minPeriods;
  undefined4 uStack_44;
  uint maxPeriods;
  int *local_38;
  
  uVar5 = numPeriods_;
  dVar9 = sampleRate * params->suggestedLatency;
  uVar3 = (ulong)dVar9;
  uVar3 = (long)(dVar9 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  if (uVar3 <= framesPerUserBuffer) {
    uVar3 = framesPerUserBuffer;
  }
  _maxPeriods = _maxPeriods & 0xffffffff00000000;
  _minPeriods = CONCAT44(uStack_44,numPeriods_);
  local_4c = 0;
  local_38 = accurate;
  iVar1 = snd_pcm_hw_params_get_periods_min(hwParams);
  if (iVar1 < 0) {
    pVar4 = pthread_self();
    iVar2 = pthread_equal(pVar4,paUnixMainThread);
    format = 
    "Expression \'alsa_snd_pcm_hw_params_get_periods_min( hwParams, &minPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2392\n"
    ;
    goto LAB_0011102e;
  }
  local_4c = 0;
  iVar1 = snd_pcm_hw_params_get_periods_max(hwParams,&maxPeriods);
  if (iVar1 < 0) {
    pVar4 = pthread_self();
    iVar2 = pthread_equal(pVar4,paUnixMainThread);
    format = 
    "Expression \'alsa_snd_pcm_hw_params_get_periods_max( hwParams, &maxPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2394\n"
    ;
    goto LAB_0011102e;
  }
  if (maxPeriods < 2) {
    __assert_fail("maxPeriods > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x95b,
                  "PaError PaAlsaStreamComponent_DetermineFramesPerBuffer(PaAlsaStreamComponent *, const PaStreamParameters *, unsigned long, double, snd_pcm_hw_params_t *, int *)"
                 );
  }
  if (uVar5 < minPeriods) {
    uVar5 = minPeriods;
  }
  if (maxPeriods < uVar5) {
    uVar5 = maxPeriods;
  }
  uVar3 = (uVar3 + framesPerUserBuffer) / (ulong)uVar5;
  framesPerHostBuffer = uVar3;
  if (framesPerUserBuffer != 0) {
    lVar7 = framesPerUserBuffer - uVar3 % framesPerUserBuffer;
    if (uVar3 % framesPerUserBuffer == 0) {
      lVar7 = 0;
    }
    uVar3 = lVar7 + uVar3;
    uVar6 = uVar3 - framesPerUserBuffer;
    framesPerHostBuffer = uVar3;
    if (uVar3 < framesPerUserBuffer) {
      if (framesPerUserBuffer % uVar3 != 0) {
        __assert_fail("framesPerUserBuffer % framesPerHostBuffer == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x970,
                      "PaError PaAlsaStreamComponent_DetermineFramesPerBuffer(PaAlsaStreamComponent *, const PaStreamParameters *, unsigned long, double, snd_pcm_hw_params_t *, int *)"
                     );
      }
      iVar1 = snd_pcm_hw_params_test_period_size(self->pcm,hwParams,uVar3,0);
      if (iVar1 < 0) {
        uVar8 = uVar3 * 2;
        iVar1 = snd_pcm_hw_params_test_period_size(self->pcm,hwParams,uVar8,0);
        if (iVar1 != 0) {
          uVar8 = uVar3 >> 1;
          iVar1 = snd_pcm_hw_params_test_period_size(self->pcm,hwParams,uVar8,0);
          if (iVar1 != 0) goto LAB_00110ec8;
        }
LAB_00110ec1:
        uVar3 = uVar8;
        framesPerHostBuffer = uVar8;
      }
    }
    else {
      if (uVar3 % framesPerUserBuffer != 0) {
        __assert_fail("framesPerHostBuffer % framesPerUserBuffer == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x97b,
                      "PaError PaAlsaStreamComponent_DetermineFramesPerBuffer(PaAlsaStreamComponent *, const PaStreamParameters *, unsigned long, double, snd_pcm_hw_params_t *, int *)"
                     );
      }
      iVar1 = snd_pcm_hw_params_test_period_size(self->pcm,hwParams,uVar3,0);
      if (iVar1 < 0) {
        uVar8 = framesPerUserBuffer + uVar3;
        iVar1 = snd_pcm_hw_params_test_period_size(self->pcm,hwParams,uVar8,0);
        if (iVar1 == 0) goto LAB_00110ec1;
        iVar1 = snd_pcm_hw_params_test_period_size(self->pcm,hwParams,uVar6,0);
        if (iVar1 == 0) {
          uVar3 = uVar6;
          framesPerHostBuffer = uVar6;
        }
      }
    }
  }
LAB_00110ec8:
  _maxPeriods = 0;
  _minPeriods = 0;
  iVar1 = snd_pcm_hw_params_get_period_size_min(hwParams,&maxPeriods,0);
  if (iVar1 < 0) {
    pVar4 = pthread_self();
    iVar2 = pthread_equal(pVar4,paUnixMainThread);
    format = 
    "Expression \'alsa_snd_pcm_hw_params_get_period_size_min( hwParams, &min, NULL )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2508\n"
    ;
  }
  else {
    iVar1 = snd_pcm_hw_params_get_period_size_max(hwParams,&minPeriods,0);
    if (iVar1 < 0) {
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      format = 
      "Expression \'alsa_snd_pcm_hw_params_get_period_size_max( hwParams, &max, NULL )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2509\n"
      ;
    }
    else {
      if (uVar3 < _maxPeriods) {
        framesPerHostBuffer = _maxPeriods + (_minPeriods - _maxPeriods == 2);
      }
      else if (_minPeriods < uVar3) {
        framesPerHostBuffer = _minPeriods - (_minPeriods - _maxPeriods == 2);
      }
      local_4c = 0;
      iVar1 = snd_pcm_hw_params_set_period_size_near(self->pcm,hwParams,&framesPerHostBuffer);
      if (-1 < iVar1) {
        if (local_4c != 0) {
          *local_38 = 0;
        }
        self->framesPerPeriod = framesPerHostBuffer;
        return 0;
      }
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      format = 
      "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( self->pcm, hwParams, &framesPerHostBuffer, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2530\n"
      ;
    }
  }
LAB_0011102e:
  if (iVar2 != 0) {
    errorText = (char *)snd_strerror(iVar1);
    PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,errorText);
  }
  PaUtil_DebugPrint(format);
  return -9999;
}

Assistant:

static PaError PaAlsaStreamComponent_DetermineFramesPerBuffer( PaAlsaStreamComponent* self, const PaStreamParameters* params,
        unsigned long framesPerUserBuffer, double sampleRate, snd_pcm_hw_params_t* hwParams, int* accurate )
{
    PaError result = paNoError;
    unsigned long bufferSize, framesPerHostBuffer;
    int dir = 0;

    /* Calculate host buffer size */
    bufferSize = PaAlsa_GetFramesPerHostBuffer(framesPerUserBuffer, params->suggestedLatency, sampleRate);

    /* Log */
    PA_DEBUG(( "%s: user-buffer (frames)           = %lu\n", __FUNCTION__, framesPerUserBuffer ));
    PA_DEBUG(( "%s: user-buffer (sec)              = %f\n",  __FUNCTION__, (double)(framesPerUserBuffer / sampleRate) ));
    PA_DEBUG(( "%s: suggested latency (sec)        = %f\n",  __FUNCTION__, params->suggestedLatency ));
    PA_DEBUG(( "%s: suggested host buffer (frames) = %lu\n", __FUNCTION__, bufferSize ));
    PA_DEBUG(( "%s: suggested host buffer (sec)    = %f\n",  __FUNCTION__, (double)(bufferSize / sampleRate) ));

#ifdef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

    if( framesPerUserBuffer != paFramesPerBufferUnspecified )
    {
        /* Preferably the host buffer size should be a multiple of the user buffer size */

        if( bufferSize > framesPerUserBuffer )
        {
            snd_pcm_uframes_t remainder = bufferSize % framesPerUserBuffer;
            if( remainder > framesPerUserBuffer / 2. )
                bufferSize += framesPerUserBuffer - remainder;
            else
                bufferSize -= remainder;

            assert( bufferSize % framesPerUserBuffer == 0 );
        }
        else if( framesPerUserBuffer % bufferSize != 0 )
        {
            /*  Find a good compromise between user specified latency and buffer size */
            if( bufferSize > framesPerUserBuffer * .75 )
            {
                bufferSize = framesPerUserBuffer;
            }
            else
            {
                snd_pcm_uframes_t newSz = framesPerUserBuffer;
                while( newSz / 2 >= bufferSize )
                {
                    if( framesPerUserBuffer % (newSz / 2) != 0 )
                    {
                        /* No use dividing any further */
                        break;
                    }
                    newSz /= 2;
                }
                bufferSize = newSz;
            }

            assert( framesPerUserBuffer % bufferSize == 0 );
        }
    }

#endif

    {
        unsigned numPeriods = numPeriods_, maxPeriods = 0, minPeriods = numPeriods_;

        /* It may be that the device only supports 2 periods for instance */
        dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_get_periods_min( hwParams, &minPeriods, &dir ), paUnanticipatedHostError );
        dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_get_periods_max( hwParams, &maxPeriods, &dir ), paUnanticipatedHostError );
        assert( maxPeriods > 1 );

        /* Clamp to min/max */
        numPeriods = PA_MIN(maxPeriods, PA_MAX(minPeriods, numPeriods));

        PA_DEBUG(( "%s: periods min = %lu, max = %lu, req = %lu \n", __FUNCTION__, minPeriods, maxPeriods, numPeriods ));

#ifndef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

        /* Calculate period size */
        framesPerHostBuffer = (bufferSize / numPeriods);

        /* Align & test size */
        if( framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* Align to user buffer size */
            framesPerHostBuffer = PaAlsa_AlignForward(framesPerHostBuffer, framesPerUserBuffer);

            /* Test (borrowed from older implementation) */
            if( framesPerHostBuffer < framesPerUserBuffer )
            {
                assert( framesPerUserBuffer % framesPerHostBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer * 2, 0 ) == 0 )
                        framesPerHostBuffer *= 2;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer / 2, 0 ) == 0 )
                        framesPerHostBuffer /= 2;
                }
            }
            else
            {
                assert( framesPerHostBuffer % framesPerUserBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer + framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer += framesPerUserBuffer;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer - framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer -= framesPerUserBuffer;
                }
            }
        }
#endif

#ifdef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

        if( framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* Try to get a power-of-two of the user buffer size. */
            framesPerHostBuffer = framesPerUserBuffer;
            if( framesPerHostBuffer < bufferSize )
            {
                while( bufferSize / framesPerHostBuffer > numPeriods )
                {
                    framesPerHostBuffer *= 2;
                }
                /* One extra period is preferable to one less (should be more robust) */
                if( bufferSize / framesPerHostBuffer < numPeriods )
                {
                    framesPerHostBuffer /= 2;
                }
            }
            else
            {
                while( bufferSize / framesPerHostBuffer < numPeriods )
                {
                    if( framesPerUserBuffer % ( framesPerHostBuffer / 2 ) != 0 )
                    {
                        /* Can't be divided any further */
                        break;
                    }
                    framesPerHostBuffer /= 2;
                }
            }

            if( framesPerHostBuffer < framesPerUserBuffer )
            {
                assert( framesPerUserBuffer % framesPerHostBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer * 2, 0 ) == 0 )
                        framesPerHostBuffer *= 2;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer / 2, 0 ) == 0 )
                        framesPerHostBuffer /= 2;
                }
            }
            else
            {
                assert( framesPerHostBuffer % framesPerUserBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer + framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer += framesPerUserBuffer;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer - framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer -= framesPerUserBuffer;
                }
            }
        }
        else
        {
            framesPerHostBuffer = bufferSize / numPeriods;
        }

        /* non-mmap mode needs a reasonably-sized buffer or it'll stutter */
        if( !self->canMmap && framesPerHostBuffer < 2048 )
            framesPerHostBuffer = 2048;
#endif
        PA_DEBUG(( "%s: suggested host buffer period   = %lu \n", __FUNCTION__, framesPerHostBuffer ));
    }

    {
        /* Get min/max period sizes and adjust our chosen */
        snd_pcm_uframes_t min = 0, max = 0, minmax_diff;
        ENSURE_( alsa_snd_pcm_hw_params_get_period_size_min( hwParams, &min, NULL ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_hw_params_get_period_size_max( hwParams, &max, NULL ), paUnanticipatedHostError );
        minmax_diff = max - min;

        if( framesPerHostBuffer < min )
        {
            PA_DEBUG(( "%s: The determined period size (%lu) is less than minimum (%lu)\n", __FUNCTION__, framesPerHostBuffer, min ));
            framesPerHostBuffer = (( minmax_diff == 2 ) ? min + 1 : min );
        }
        else if( framesPerHostBuffer > max )
        {
            PA_DEBUG(( "%s: The determined period size (%lu) is greater than maximum (%lu)\n", __FUNCTION__, framesPerHostBuffer, max ));
            framesPerHostBuffer = (( minmax_diff == 2 ) ? max - 1 : max );
        }

        PA_DEBUG(( "%s: device period minimum          = %lu\n", __FUNCTION__, min ));
        PA_DEBUG(( "%s: device period maximum          = %lu\n", __FUNCTION__, max ));
        PA_DEBUG(( "%s: host buffer period             = %lu\n", __FUNCTION__, framesPerHostBuffer ));
        PA_DEBUG(( "%s: host buffer period latency     = %f\n", __FUNCTION__, (double)( framesPerHostBuffer / sampleRate ) ));

        /* Try setting period size */
        dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( self->pcm, hwParams, &framesPerHostBuffer, &dir ), paUnanticipatedHostError );
        if( dir != 0 )
        {
            PA_DEBUG(( "%s: The configured period size is non-integer.\n", __FUNCTION__, dir ));
            *accurate = 0;
        }
    }

    /* Set result */
    self->framesPerPeriod = framesPerHostBuffer;

error:
    return result;
}